

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void MapOptHandler_PrecacheTextures(FMapInfoParser *parse,level_info_t *info)

{
  uint *puVar1;
  bool bVar2;
  FString local_30;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  do {
    FScanner::MustGetString(&parse->sc);
    FString::FString(&local_30,(parse->sc).String);
    TArray<FString,_FString>::Grow(&info->PrecacheTextures,1);
    FString::AttachToOther
              ((info->PrecacheTextures).Array + (info->PrecacheTextures).Count,&local_30);
    puVar1 = &(info->PrecacheTextures).Count;
    *puVar1 = *puVar1 + 1;
    FString::~FString(&local_30);
    bVar2 = FScanner::CheckString(&parse->sc,",");
  } while (bVar2);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheTextures, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		//the texture manager is not initialized here so all we can do is store the texture's name.
		info->PrecacheTextures.Push(parse.sc.String);
	} while (parse.sc.CheckString(","));
}